

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_encode.c
# Opt level: O3

int cram_put_bam_seq(cram_fd *fd,bam_seq_t *b)

{
  uint uVar1;
  spare_bams *__ptr;
  int iVar2;
  int iVar3;
  int iVar4;
  cram_container *c;
  cram_slice *pcVar5;
  int *piVar6;
  bam_seq_t **ppbVar7;
  bam1_t *pbVar8;
  int iVar9;
  int iVar10;
  cram_block_slice_hdr *pcVar11;
  bam_seq_t *pbVar12;
  int32_t iVar13;
  int iVar14;
  long lVar15;
  bool bVar16;
  
  c = fd->ctr;
  if (c == (cram_container *)0x0) {
    c = cram_new_container(fd->seqs_per_slice,fd->slices_per_container);
    fd->ctr = c;
    if (c != (cram_container *)0x0) {
      c->record_counter = fd->record_counter;
      goto LAB_00128364;
    }
LAB_0012887c:
    iVar10 = -1;
  }
  else {
LAB_00128364:
    if (((c->slice == (cram_slice *)0x0) || (c->curr_rec == c->max_rec)) ||
       (-2 < c->curr_ref && (b->core).tid != c->curr_ref)) {
      bVar16 = fd->multi_seq == 1;
      pbVar12 = (bam_seq_t *)&c->curr_ref;
      if (c->slice == (cram_slice *)0x0) {
        pbVar12 = b;
      }
      iVar10 = (pbVar12->core).tid;
      if (fd->multi_seq == -1) {
        iVar3 = c->max_rec;
        iVar2 = iVar3 + 3;
        if (-1 < iVar3) {
          iVar2 = iVar3;
        }
        iVar3 = (iVar2 >> 2) + 10;
        if (c->curr_rec < iVar3) {
          bVar16 = false;
          if ((fd->last_slice != 0) && (fd->last_slice < iVar3)) {
            if (fd->embed_ref != 0) goto LAB_001283e7;
            bVar16 = true;
            if ((fd->verbose != 0) && (c->multi_seq == 0)) {
              cram_put_bam_seq_cold_1();
            }
          }
        }
        else {
LAB_001283e7:
          bVar16 = false;
        }
      }
      iVar3 = c->curr_rec;
      iVar2 = c->slice_rec;
      if (((((fd->version & 0xffffff00U) == 0x100) || (iVar3 == c->max_rec)) || (fd->multi_seq != 1)
          ) || (iVar4 = iVar3, c->slice == (cram_slice *)0x0)) {
        c = fd->ctr;
        iVar4 = c->curr_ref;
        if (iVar4 == -2) {
          iVar4 = (b->core).tid;
          c->curr_ref = iVar4;
        }
        if (c->slice == (cram_slice *)0x0) {
          iVar9 = c->curr_slice;
        }
        else {
          pcVar11 = c->slice->hdr;
          if (c->multi_seq == 0) {
            iVar9 = c->first_base;
            iVar13 = (c->last_base - iVar9) + 1;
            iVar14 = iVar4;
          }
          else {
            iVar9 = 0;
            iVar13 = 0;
            iVar14 = -2;
          }
          pcVar11->ref_seq_id = iVar14;
          pcVar11->ref_seq_start = iVar9;
          pcVar11->ref_seq_span = iVar13;
          pcVar11->num_records = c->curr_rec;
          if (c->curr_slice == 0) {
            if (c->ref_seq_id != iVar14) {
              c->ref_seq_id = iVar14;
            }
            c->ref_seq_start = c->first_base;
          }
          iVar9 = c->curr_slice + 1;
          c->curr_slice = iVar9;
        }
        if ((iVar9 == c->max_slice) || (((b->core).tid != iVar4 && (c->multi_seq == 0)))) {
          c->ref_seq_span = (fd->last_base - c->ref_seq_start) + 1;
          if (fd->verbose != 0) {
            fprintf(_stderr,"Flush container %d/%d..%d\n",(ulong)(uint)c->ref_seq_id);
          }
          if (fd->pool == (t_pool *)0x0) {
            iVar4 = cram_flush_container(fd,c);
            if (iVar4 == -1) goto LAB_00128609;
            if (0 < c->max_slice) {
              lVar15 = 0;
              do {
                cram_free_slice(c->slices[lVar15]);
                c->slices[lVar15] = (cram_slice *)0x0;
                lVar15 = lVar15 + 1;
              } while (lVar15 < c->max_slice);
            }
            c->slice = (cram_slice *)0x0;
            c->curr_slice = 0;
            cram_free_container(c);
          }
          else {
            iVar4 = cram_flush_container_mt(fd,c);
            if (iVar4 == -1) goto LAB_00128609;
          }
          c = cram_new_container(fd->seqs_per_slice,fd->slices_per_container);
          fd->ctr = c;
          if (c == (cram_container *)0x0) goto LAB_0012887c;
          c->record_counter = fd->record_counter;
          c->curr_ref = (b->core).tid;
        }
        iVar4 = (b->core).pos + 1;
        c->last_base = iVar4;
        c->first_base = iVar4;
        c->last_pos = iVar4;
        pcVar5 = cram_new_slice(MAPPED_SLICE,c->max_rec);
        c->slices[c->curr_slice] = pcVar5;
        c->slice = pcVar5;
        if (pcVar5 == (cram_slice *)0x0) {
LAB_00128609:
          if (fd->ctr == (cram_container *)0x0) {
            return -1;
          }
          cram_free_container(fd->ctr);
          fd->ctr = (cram_container *)0x0;
          return -1;
        }
        if (c->multi_seq == 0) {
          pcVar11 = pcVar5->hdr;
          pcVar11->ref_seq_id = (b->core).tid;
          iVar13 = (b->core).pos + 1;
          iVar4 = iVar13;
        }
        else {
          pcVar11 = pcVar5->hdr;
          pcVar11->ref_seq_id = -2;
          iVar13 = 0;
          iVar4 = 1;
        }
        pcVar11->ref_seq_start = iVar13;
        pcVar5->last_apos = iVar4;
        c->curr_rec = 0;
        iVar4 = 0;
      }
      if (bVar16) {
        fd->multi_seq = 1;
        c->multi_seq = 1;
        c->pos_sorted = 0;
        if (c->refs_used == (int *)0x0) {
          pthread_mutex_lock((pthread_mutex_t *)&fd->ref_lock);
          piVar6 = (int *)calloc((long)fd->refs->nref,4);
          c->refs_used = piVar6;
          pthread_mutex_unlock((pthread_mutex_t *)&fd->ref_lock);
          if (c->refs_used == (int *)0x0) goto LAB_0012887c;
          iVar4 = c->curr_rec;
        }
      }
      fd->last_slice = iVar3 - iVar2;
      c->slice_rec = iVar4;
      iVar3 = (b->core).tid;
      if (((-1 < (long)iVar3) && (iVar3 != iVar10)) &&
         ((fd->embed_ref == 0 && (bVar16 && fd->unsorted == 0)))) {
        if (c->refs_used == (int *)0x0) {
          pthread_mutex_lock((pthread_mutex_t *)&fd->ref_lock);
          piVar6 = (int *)calloc((long)fd->refs->nref,4);
          c->refs_used = piVar6;
          pthread_mutex_unlock((pthread_mutex_t *)&fd->ref_lock);
          if (c->refs_used == (int *)0x0) goto LAB_0012887c;
        }
        else if (c->refs_used[iVar3] != 0) {
          cram_put_bam_seq_cold_2();
        }
      }
      uVar1 = (b->core).tid;
      c->curr_ref = uVar1;
      if (-1 < (int)uVar1 && c->refs_used != (int *)0x0) {
        piVar6 = c->refs_used + uVar1;
        *piVar6 = *piVar6 + 1;
      }
    }
    ppbVar7 = c->bams;
    if (ppbVar7 == (bam_seq_t **)0x0) {
      pthread_mutex_lock((pthread_mutex_t *)&fd->bam_list_lock);
      __ptr = fd->bl;
      if (__ptr == (spare_bams *)0x0) {
        ppbVar7 = (bam_seq_t **)calloc((long)c->max_c_rec,8);
        c->bams = ppbVar7;
        if (ppbVar7 == (bam_seq_t **)0x0) goto LAB_0012887c;
      }
      else {
        c->bams = __ptr->bams;
        fd->bl = __ptr->next;
        free(__ptr);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&fd->bam_list_lock);
      ppbVar7 = c->bams;
    }
    if (ppbVar7[c->curr_c_rec] == (bam1_t *)0x0) {
      pbVar8 = bam_init1();
      pbVar8 = bam_copy1(pbVar8,b);
      iVar10 = c->curr_c_rec;
      c->bams[iVar10] = pbVar8;
    }
    else {
      bam_copy1(ppbVar7[c->curr_c_rec],b);
      iVar10 = c->curr_c_rec;
    }
    c->curr_rec = c->curr_rec + 1;
    c->curr_c_rec = iVar10 + 1;
    fd->record_counter = fd->record_counter + 1;
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

int cram_put_bam_seq(cram_fd *fd, bam_seq_t *b) {
    cram_container *c;

    if (!fd->ctr) {
	fd->ctr = cram_new_container(fd->seqs_per_slice,
				     fd->slices_per_container);
	if (!fd->ctr)
	    return -1;
	fd->ctr->record_counter = fd->record_counter;
    }
    c = fd->ctr;

    if (!c->slice || c->curr_rec == c->max_rec ||
	(bam_ref(b) != c->curr_ref && c->curr_ref >= -1)) {
	int slice_rec, curr_rec, multi_seq = fd->multi_seq == 1;
	int curr_ref = c->slice ? c->curr_ref : bam_ref(b);


	/*
	 * Start packing slices when we routinely have under 1/4tr full.
	 *
	 * This option isn't available if we choose to embed references
	 * since we can only have one per slice.
	 */
	if (fd->multi_seq == -1 && c->curr_rec < c->max_rec/4+10 &&
	    fd->last_slice && fd->last_slice < c->max_rec/4+10 &&
	    !fd->embed_ref) {
	    if (fd->verbose && !c->multi_seq)
		fprintf(stderr, "Multi-ref enabled for this container\n");
	    multi_seq = 1;
	}

	slice_rec = c->slice_rec;
	curr_rec  = c->curr_rec;

	if (CRAM_MAJOR_VERS(fd->version) == 1 ||
	    c->curr_rec == c->max_rec || fd->multi_seq != 1 || !c->slice) {
	    if (NULL == (c = cram_next_container(fd, b))) {
		if (fd->ctr) {
		    // prevent cram_close attempting to flush
		    cram_free_container(fd->ctr);
		    fd->ctr = NULL;
		}
		return -1;
	    }
	}

	/*
	 * Due to our processing order, some things we've already done we
	 * cannot easily undo. So when we first notice we should be packing
	 * multiple sequences per container we emit the small partial
	 * container as-is and then start a fresh one in a different mode.
	 */
	if (multi_seq) {
	    fd->multi_seq = 1;
	    c->multi_seq = 1;
	    c->pos_sorted = 0; // required atm for multi_seq slices

	    if (!c->refs_used) {
		pthread_mutex_lock(&fd->ref_lock);
		c->refs_used = calloc(fd->refs->nref, sizeof(int));
		pthread_mutex_unlock(&fd->ref_lock);
		if (!c->refs_used)
		    return -1;
	    }
	}

	fd->last_slice = curr_rec - slice_rec;
	c->slice_rec = c->curr_rec;

	// Have we seen this reference before?
	if (bam_ref(b) >= 0 && bam_ref(b) != curr_ref && !fd->embed_ref &&
	    !fd->unsorted && multi_seq) {
	    
	    if (!c->refs_used) {
		pthread_mutex_lock(&fd->ref_lock);
		c->refs_used = calloc(fd->refs->nref, sizeof(int));
		pthread_mutex_unlock(&fd->ref_lock);
		if (!c->refs_used)
		    return -1;
	    } else if (c->refs_used && c->refs_used[bam_ref(b)]) {
		fprintf(stderr, "Unsorted mode enabled\n");
		pthread_mutex_lock(&fd->ref_lock);
		fd->unsorted = 1;
		pthread_mutex_unlock(&fd->ref_lock);
		fd->multi_seq = 1;
	    }
	}

	c->curr_ref = bam_ref(b);
	if (c->refs_used && c->curr_ref >= 0) c->refs_used[c->curr_ref]++;
    }

    if (!c->bams) {
	/* First time through, allocate a set of bam pointers */
	pthread_mutex_lock(&fd->bam_list_lock);
	if (fd->bl) {
	    spare_bams *spare = fd->bl;
	    c->bams = spare->bams;
	    fd->bl = spare->next;
	    free(spare);
	} else {
	    c->bams = calloc(c->max_c_rec, sizeof(bam_seq_t *));
	    if (!c->bams)
		return -1;
	}
	pthread_mutex_unlock(&fd->bam_list_lock);
    }

    /* Copy or alloc+copy the bam record, for later encoding */
    if (c->bams[c->curr_c_rec])
	bam_copy1(c->bams[c->curr_c_rec], b);
    else
	c->bams[c->curr_c_rec] = bam_dup(b);

    c->curr_rec++;
    c->curr_c_rec++;
    fd->record_counter++;

    return 0;
}